

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vpcmpccb(PDISASM pMyDisasm)

{
  byte bVar1;
  char local_118 [8];
  char pseudoOpcodes_uq [8] [16];
  char pseudoOpcodes_ud [8] [16];
  UInt8 Imm8;
  PDISASM pMyDisasm_local;
  
  memcpy(pseudoOpcodes_uq[7] + 8,"vpcmpeqb",0x80);
  memcpy(local_118,"vpcmpeqw",0x80);
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      (pMyDisasm->Reserved_).EVEX.masking = '\x01';
      (pMyDisasm->Operand1).AccessMode = 1;
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).Register_ = 0x400;
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        (pMyDisasm->Reserved_).Register_ = 4;
        (pMyDisasm->Reserved_).MemDecoration = 0xd1;
      }
      else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
        (pMyDisasm->Reserved_).Register_ = 8;
        (pMyDisasm->Reserved_).MemDecoration = 0xd2;
      }
      else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
        (pMyDisasm->Reserved_).Register_ = 0x10;
        (pMyDisasm->Reserved_).MemDecoration = 0xd6;
      }
      fillRegister((((pMyDisasm->Reserved_).VEX.vvvv ^ 0xffffffff) & 0xf) +
                   (uint)(pMyDisasm->Reserved_).EVEX.V * 0x10,&pMyDisasm->Operand2,pMyDisasm);
      decodeModrm(&pMyDisasm->Operand3,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
      bVar1 = (byte)(pMyDisasm->Instruction).Immediat & 7;
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        strcpy((pMyDisasm->Instruction).Mnemonic,pseudoOpcodes_uq[(ulong)bVar1 + 7] + 8);
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,pseudoOpcodes_uq[(ulong)bVar1 - 1] + 8);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vpcmpccb(PDISASM pMyDisasm)
{
  UInt8 Imm8;

  char pseudoOpcodes_ud[8][16] = {
    "vpcmpeqb",
    "vpcmpltb",
    "vpcmpleb",
    "vpcmpfalseb",
    "vpcmpneqb",
    "vpcmpnltb",
    "vpcmpnleb",
    "vpcmptrueb"
  };
  char pseudoOpcodes_uq[8][16] = {
    "vpcmpeqw",
    "vpcmpltw",
    "vpcmplew",
    "vpcmpfalsew",
    "vpcmpneqw",
    "vpcmpnltw",
    "vpcmpnlew",
    "vpcmptruew"
  };
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      GV.EVEX.tupletype = FULL;
      GV.EVEX.masking = MERGING;
      pMyDisasm->Operand1.AccessMode = READ;
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      GV.Register_ = OPMASK_REG;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      if (GV.VEX.L == 0) {
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg3_m128_xmm;
      }
      else if (GV.VEX.L == 0x1) {
        GV.Register_ = AVX_REG;
        GV.MemDecoration = Arg3_m256_ymm;
      }
      else if (GV.EVEX.LL == 0x2) {
        GV.Register_ = AVX512_REG;
        GV.MemDecoration = Arg3_m512_zmm;
      }
      fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand2, pMyDisasm);
      decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      Imm8 = pMyDisasm->Instruction.Immediat & 0x7;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, pseudoOpcodes_ud[Imm8]);
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, pseudoOpcodes_uq[Imm8]);
        #endif
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}